

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

var cs_impl::runtime_cs_ext::wait_worker(callable *func,vector *args)

{
  proxy *in_RDI;
  lang_error *le;
  exception *e;
  vector *in_stack_ffffffffffffff80;
  callable *in_stack_ffffffffffffff88;
  
  cs::callable::call(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  return (var)in_RDI;
}

Assistant:

var wait_worker(const cs::callable &func, cs::vector &args)
		{
			try {
				return func.call(args);
			}
			catch (const lang_error &le) {
				std::cerr << "wait thread terminated after throwing an instance of runtime exception" << std::endl;
				std::cerr << "what(): " << le.what() << std::endl;
			}
			catch (const std::exception &e) {
				std::cerr << "wait thread terminated after throwing an instance of exception" << std::endl;
				std::cerr << "what(): " << e.what() << std::endl;
			}
			catch (...) {
				std::cerr << "wait thread terminated after throwing an instance of unknown exception" << std::endl;
			}
			return null_pointer;
		}